

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatbase.c
# Opt level: O2

int ecx_LWR(ecx_portt *port,uint32 LogAdr,uint16 length,void *data,int timeout)

{
  uint uVar1;
  int iVar2;
  uint idx;
  
  uVar1 = ecx_getindex(port);
  idx = uVar1 & 0xff;
  ecx_setupdatagram(port,port->txbuf + idx,'\v',(uint8)uVar1,(uint16)LogAdr,(uint16)(LogAdr >> 0x10)
                    ,length,data);
  iVar2 = ecx_srconfirm(port,idx,timeout);
  ecx_setbufstat(port,idx,0);
  return iVar2;
}

Assistant:

int ecx_LWR(ecx_portt *port, uint32 LogAdr, uint16 length, void *data, int timeout)
{
   uint8 idx;
   int wkc;

   idx = ecx_getindex(port);
   ecx_setupdatagram(port, &(port->txbuf[idx]), EC_CMD_LWR, idx, LO_WORD(LogAdr), HI_WORD(LogAdr), length, data);
   wkc = ecx_srconfirm(port, idx, timeout);
   ecx_setbufstat(port, idx, EC_BUF_EMPTY);

   return wkc;
}